

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

void __thiscall AI::Task::addSubtask(Task *this,Task *task)

{
  pointer pTVar1;
  
  pTVar1 = (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(&this->subtasks,task);
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  return;
}

Assistant:

void Task::addSubtask(Task& task)
	{
		if (!subtasks.empty())
		{
			subtasks.back().isLastInCompound = false;
		}

		subtasks.push_back(task);
		subtasks.back().isLastInCompound = true;
	}